

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::reset_peer_info(raft_server *this)

{
  ulong uVar1;
  element_type *peVar2;
  long *plVar3;
  element_type *peVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined1 local_89;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> my_next_config;
  ptr<cluster_config> c_config;
  ptr<log_entry> entry;
  undefined1 local_38 [8];
  ptr<srv_config> my_srv_config;
  
  get_config((raft_server *)&c_config);
  uVar1 = ((c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->servers_).
          super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          ._M_impl._M_node._M_size;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar5 = (*peVar2->_vptr_logger[7])();
    if (4 < iVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&new_conf_buf,"servers: %zu\n",uVar1);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"reset_peer_info",0x2ed,&new_conf_buf);
      std::__cxx11::string::~string((string *)&new_conf_buf);
    }
  }
  if (1 < uVar1) {
    cluster_config::get_server
              ((cluster_config *)&my_srv_config,
               (int)c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    if (my_srv_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (*peVar2->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&new_conf_buf,"my_srv_config is NULL");
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"reset_peer_info",0x2f4,&new_conf_buf);
          std::__cxx11::string::~string((string *)&new_conf_buf);
        }
      }
    }
    else {
      new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->log_idx_;
      entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->prev_log_idx_;
      std::make_shared<nuraft::cluster_config,unsigned_long,unsigned_long>
                ((unsigned_long *)&my_next_config,(unsigned_long *)&new_conf_buf);
      std::__cxx11::
      list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::push_back(&(my_next_config.
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   servers_,&my_srv_config);
      peVar4 = my_next_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__cxx11::string::string
                ((string *)&new_conf_buf,
                 (string *)
                 &(c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->user_ctx_);
      std::__cxx11::string::_M_assign((string *)&peVar4->user_ctx_);
      std::__cxx11::string::~string((string *)&new_conf_buf);
      (my_next_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->async_replication_ =
           (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->async_replication_;
      set_config(this,&my_next_config);
      plVar3 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar3 + 0x18))
                (plVar3,my_next_config.
                        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      cluster_config::serialize((cluster_config *)&new_conf_buf);
      local_38 = (undefined1  [8])
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      local_89 = 2;
      timer_helper::get_timeofday_us();
      std::
      make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
                ((unsigned_long *)&entry,(shared_ptr<nuraft::buffer> *)local_38,
                 (log_val_type *)&new_conf_buf,(unsigned_long *)&local_89);
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      store_log_entry(this,&entry,CONCAT44(extraout_var,iVar5) - 1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&my_next_config.
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&my_srv_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void raft_server::reset_peer_info() {
    ptr<cluster_config> c_config = get_config();
    auto const srv_cnt = c_config->get_servers().size();
    p_db("servers: %zu\n", srv_cnt);
    if (srv_cnt > 1) {
        ptr<srv_config> my_srv_config = c_config->get_server(id_);
        if (!my_srv_config) {
            // It means that this node was removed, and then
            // added again (it shouldn't happen though).
            // Just return.
            p_wn("my_srv_config is NULL");
            return;
        }

        ptr<cluster_config> my_next_config = cs_new<cluster_config>
            ( c_config->get_log_idx(), c_config->get_prev_log_idx() );
        my_next_config->get_servers().push_back(my_srv_config);
        my_next_config->set_user_ctx( c_config->get_user_ctx() );
        my_next_config->set_async_replication
                        ( c_config->is_async_replication() );

        set_config(my_next_config);
        ctx_->state_mgr_->save_config(*my_next_config);

        // Make its local temporary log for configuration.
        // It will be rolled back and overwritten if this node
        // re-joins the cluster.
        ptr<buffer> new_conf_buf(my_next_config->serialize());
        ptr<log_entry> entry(cs_new<log_entry>(
            state_->get_term(), new_conf_buf, log_val_type::conf,
            timer_helper::get_timeofday_us()));
        store_log_entry(entry, log_store_->next_slot()-1);
    }
}